

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDebugUtils.cpp
# Opt level: O0

void JsrtDebugUtils::AddLineColumnToObject
               (DynamicObject *object,FunctionBody *functionBody,int byteCodeOffset)

{
  LONG value;
  ULONG value_00;
  FunctionBody *pFVar1;
  bool bVar2;
  ScriptContext *pSVar3;
  JsrtDebugPropertyId local_2c;
  JsrtDebugPropertyId local_28;
  LONG local_24;
  ULONG local_20;
  LONG col;
  ULONG line;
  int byteCodeOffset_local;
  FunctionBody *functionBody_local;
  DynamicObject *object_local;
  
  if (functionBody != (FunctionBody *)0x0) {
    local_20 = 0;
    local_24 = 0;
    col = byteCodeOffset;
    _line = functionBody;
    functionBody_local = (FunctionBody *)object;
    bVar2 = Js::FunctionBody::GetLineCharOffset
                      (functionBody,byteCodeOffset,&local_20,&local_24,false);
    pFVar1 = functionBody_local;
    if (bVar2) {
      JsrtDebugPropertyId::JsrtDebugPropertyId(&local_28,line);
      value_00 = local_20;
      pSVar3 = Js::FunctionProxy::GetScriptContext((FunctionProxy *)_line);
      AddPropertyToObject((DynamicObject *)pFVar1,local_28,value_00,pSVar3);
      pFVar1 = functionBody_local;
      JsrtDebugPropertyId::JsrtDebugPropertyId(&local_2c,column);
      value = local_24;
      pSVar3 = Js::FunctionProxy::GetScriptContext((FunctionProxy *)_line);
      AddPropertyToObject((DynamicObject *)pFVar1,local_2c,value,pSVar3);
    }
  }
  return;
}

Assistant:

void JsrtDebugUtils::AddLineColumnToObject(Js::DynamicObject* object, Js::FunctionBody* functionBody, int byteCodeOffset)
{
    if (functionBody != nullptr)
    {
        ULONG line = 0;
        LONG col = 0;
        if (functionBody->GetLineCharOffset(byteCodeOffset, &line, &col, false))
        {
            JsrtDebugUtils::AddPropertyToObject(object, JsrtDebugPropertyId::line, (uint32) line, functionBody->GetScriptContext());
            JsrtDebugUtils::AddPropertyToObject(object, JsrtDebugPropertyId::column, (int32) col, functionBody->GetScriptContext());
        }
    }
}